

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffrhdu(fitsfile *fptr,int *hdutype,int *status)

{
  char *pcVar1;
  FITSfile *pFVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  int tstatus;
  char urltype [20];
  char card [81];
  char name [75];
  char value [71];
  char local_c9;
  char xname [71];
  char comm [73];
  
  if (0 < *status) {
    return *status;
  }
  iVar3 = ffgrec(fptr,1,card,status);
  if (iVar3 < 1) {
    strncpy(name,card,8);
    name[8] = '\0';
    for (uVar4 = 7; (-1 < (int)uVar4 && (name[uVar4] == ' ')); uVar4 = uVar4 - 1) {
      name[uVar4] = '\0';
    }
    iVar3 = ffpsvc(card,value,comm,status);
    if (iVar3 < 1) {
      iVar3 = bcmp(name,"SIMPLE",7);
      if (iVar3 == 0) {
        ffpinit(fptr,status);
LAB_00145e5d:
        if (hdutype != (int *)0x0) {
          *hdutype = 0;
        }
      }
      else {
        iVar3 = bcmp(name,"XTENSION",9);
        if (iVar3 == 0) {
          iVar3 = ffc2s(value,xname,status);
          if (0 < iVar3) {
            ffpmsg("Bad value string for XTENSION keyword:");
            pcVar5 = value;
            goto LAB_00145df0;
          }
          pcVar5 = &local_c9;
          do {
            pcVar1 = pcVar5 + 1;
            pcVar5 = pcVar5 + 1;
          } while (*pcVar1 == ' ');
          iVar3 = strcmp(pcVar5,"TABLE");
          if (iVar3 == 0) {
            ffainit(fptr,status);
            if (hdutype != (int *)0x0) {
              *hdutype = 1;
            }
          }
          else {
            iVar3 = strcmp(pcVar5,"BINTABLE");
            if (iVar3 != 0) {
              iVar3 = strcmp(pcVar5,"A3DTABLE");
              if (iVar3 != 0) {
                iVar3 = strcmp(pcVar5,"3DTABLE");
                if (iVar3 != 0) {
                  tstatus = 0;
                  ffpinit(fptr,&tstatus);
                  if (hdutype == (int *)0x0 || tstatus != 0xfb) {
                    *status = tstatus;
                    goto LAB_00145e5d;
                  }
                  *hdutype = -1;
                  goto LAB_00145ebd;
                }
              }
            }
            ffbinit(fptr,status);
            if (hdutype != (int *)0x0) {
              *hdutype = 2;
            }
          }
        }
        else if ((card[0] == '\n') || (card[0] == '\0')) {
          *status = 0x6b;
        }
        else {
          *status = 0xfc;
          ffpmsg("Extension doesn\'t start with SIMPLE or XTENSION keyword. (ffrhdu)");
          ffpmsg(card);
        }
      }
LAB_00145ebd:
      pFVar2 = fptr->Fptr;
      if (pFVar2->headstart[(long)pFVar2->curhdu + 1] < pFVar2->logfilesize) {
        pFVar2->lasthdu = 0;
      }
      else {
        pFVar2->lasthdu = 1;
        ffurlt(fptr,urltype,status);
        iVar3 = bcmp(urltype,"mem://",7);
        if (iVar3 != 0) {
          iVar3 = bcmp(urltype,"memkeep://",0xb);
          if (iVar3 != 0) goto LAB_00145df5;
        }
        fftrun(fptr,fptr->Fptr->headstart[(long)fptr->Fptr->curhdu + 1],status);
      }
      goto LAB_00145df5;
    }
    ffpmsg("Cannot read value of first  keyword in header (ffrhdu):");
    pcVar5 = card;
  }
  else {
    pcVar5 = "Cannot read first keyword in header (ffrhdu).";
  }
LAB_00145df0:
  ffpmsg(pcVar5);
LAB_00145df5:
  return *status;
}

Assistant:

int ffrhdu(fitsfile *fptr,    /* I - FITS file pointer */
           int *hdutype,      /* O - type of HDU       */
           int *status)       /* IO - error status     */
/*
  read the required keywords of the CHDU and initialize the corresponding
  structure elements that describe the format of the HDU
*/
{
    int ii, tstatus;
    char card[FLEN_CARD];
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char xname[FLEN_VALUE], *xtension, urltype[20];

    if (*status > 0)
        return(*status);

    if (ffgrec(fptr, 1, card, status) > 0 )  /* get the 80-byte card */
    {
        ffpmsg("Cannot read first keyword in header (ffrhdu).");
        return(*status);
    }
    strncpy(name,card,8);  /* first 8 characters = the keyword name */
    name[8] = '\0';

    for (ii=7; ii >= 0; ii--)  /* replace trailing blanks with nulls */
    {
        if (name[ii] == ' ')
            name[ii] = '\0';
        else
            break;
    }

    if (ffpsvc(card, value, comm, status) > 0)   /* parse value and comment */
    {
        ffpmsg("Cannot read value of first  keyword in header (ffrhdu):");
        ffpmsg(card);
        return(*status);
    }

    if (!strcmp(name, "SIMPLE"))        /* this is the primary array */
    {

       ffpinit(fptr, status);           /* initialize the primary array */

       if (hdutype != NULL)
           *hdutype = 0;
    }

    else if (!strcmp(name, "XTENSION"))   /* this is an XTENSION keyword */
    {
        if (ffc2s(value, xname, status) > 0)  /* get the value string */
        {
            ffpmsg("Bad value string for XTENSION keyword:");
            ffpmsg(value);
            return(*status);
        }

        xtension = xname;
        while (*xtension == ' ')  /* ignore any leading spaces in name */
           xtension++;

        if (!strcmp(xtension, "TABLE"))
        {
            ffainit(fptr, status);       /* initialize the ASCII table */
            if (hdutype != NULL)
                *hdutype = 1;
        }

        else if (!strcmp(xtension, "BINTABLE") ||
                 !strcmp(xtension, "A3DTABLE") ||
                 !strcmp(xtension, "3DTABLE") )
        {
            ffbinit(fptr, status);       /* initialize the binary table */
            if (hdutype != NULL)
                *hdutype = 2;
        }

        else
        {
            tstatus = 0;
            ffpinit(fptr, &tstatus);       /* probably an IMAGE extension */

            if (tstatus == UNKNOWN_EXT && hdutype != NULL)
                *hdutype = -1;       /* don't recognize this extension type */
            else
            {
                *status = tstatus;
                if (hdutype != NULL)
                    *hdutype = 0;
            }
        }
    }

    else     /*  not the start of a new extension */
    {
        if (card[0] == 0  ||
            card[0] == 10)     /* some editors append this character to EOF */
        {           
            *status = END_OF_FILE;
        }
        else
        {
          *status = UNKNOWN_REC;  /* found unknown type of record */
          ffpmsg
        ("Extension doesn't start with SIMPLE or XTENSION keyword. (ffrhdu)");
        ffpmsg(card);
        }
    }

    /*  compare the starting position of the next HDU (if any) with the size */
    /*  of the whole file to see if this is the last HDU in the file */

    if ((fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] < 
        (fptr->Fptr)->logfilesize )
    {
        (fptr->Fptr)->lasthdu = 0;  /* no, not the last HDU */
    }
    else
    {
        (fptr->Fptr)->lasthdu = 1;  /* yes, this is the last HDU */

        /* special code for mem:// type files (FITS file in memory) */
        /* Allocate enough memory to hold the entire HDU. */
        /* Without this code, CFITSIO would repeatedly realloc  memory */
        /* to incrementally increase the size of the file by 2880 bytes */
        /* at a time, until it reached the final size */
 
        ffurlt(fptr, urltype, status);
        if (!strcmp(urltype,"mem://") || !strcmp(urltype,"memkeep://"))
        {
            fftrun(fptr, (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1],
               status);
        }
    }
    return(*status);
}